

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O2

void * cipher_dupctx(void *vsrc)

{
  GOST_CTX *pGVar1;
  
  pGVar1 = cipher_newctx(*vsrc,*(GOST_cipher **)((long)vsrc + 0x10),*(OSSL_PARAM **)((long)vsrc + 8)
                        );
  if (pGVar1 != (GOST_CTX *)0x0) {
    EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)pGVar1->cctx,*(EVP_CIPHER_CTX **)((long)vsrc + 0x20));
  }
  return pGVar1;
}

Assistant:

static void *cipher_dupctx(void *vsrc)
{
    GOST_CTX *src = vsrc;
    GOST_CTX *dst =
        cipher_newctx(src->provctx, src->descriptor, src->known_params);

    if (dst != NULL)
        EVP_CIPHER_CTX_copy(dst->cctx, src->cctx);
    return dst;
}